

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O1

vector<int,_std::allocator<int>_> * __thiscall
fasttext::Dictionary::getSubwords
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,Dictionary *this,string *word)

{
  size_t __n;
  int32_t iVar1;
  int iVar2;
  vector<int,_std::allocator<int>_> *__x;
  long *plVar3;
  size_type *psVar4;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  iVar1 = find(this,word);
  iVar1 = (this->word2int_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[iVar1];
  if (-1 < iVar1) {
    __x = getSubwords(this,iVar1);
    std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__,__x);
    return __return_storage_ptr__;
  }
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __n = word->_M_string_length;
  if (__n == DAT_00136390) {
    if (__n == 0) {
      return __return_storage_ptr__;
    }
    iVar2 = bcmp((word->_M_dataplus)._M_p,EOS_abi_cxx11_,__n);
    if (iVar2 == 0) {
      return __return_storage_ptr__;
    }
  }
  std::operator+(&local_38,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)BOW_abi_cxx11_
                 ,word);
  plVar3 = (long *)std::__cxx11::string::_M_append((char *)&local_38,EOW_abi_cxx11_);
  psVar4 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    local_58.field_2._M_allocated_capacity = *psVar4;
    local_58.field_2._8_8_ = plVar3[3];
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  }
  else {
    local_58.field_2._M_allocated_capacity = *psVar4;
    local_58._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_58._M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  computeSubwords(this,&local_58,__return_storage_ptr__,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

const std::vector<int32_t> Dictionary::getSubwords(
		const std::string& word) const {
	int32_t i = getId(word);
	if (i >= 0) {
		return getSubwords(i);
	}
	std::vector<int32_t> ngrams;
	if (word != EOS) {
		computeSubwords(BOW + word + EOW, ngrams);
	}
	return ngrams;
}